

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void av1_dr_prediction_z1_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  uint8_t uVar1;
  ushort uVar2;
  undefined8 uVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ushort uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined8 local_438 [129];
  
  uVar14 = (ulong)(uint)bh;
  bVar5 = (byte)upsample_above;
  if (bw < 0x10) {
    if (bw == 4) {
      iVar8 = bh + 3 << (bVar5 & 0x1f);
      if (0 < bh) {
        uVar1 = above[iVar8];
        auVar17[1] = uVar1;
        auVar17[0] = uVar1;
        auVar17[2] = uVar1;
        auVar17[3] = uVar1;
        auVar17[4] = uVar1;
        auVar17[5] = uVar1;
        auVar17[6] = uVar1;
        auVar17[7] = uVar1;
        auVar17[8] = uVar1;
        auVar17[9] = uVar1;
        auVar17[10] = uVar1;
        auVar17[0xb] = uVar1;
        auVar17[0xc] = uVar1;
        auVar17[0xd] = uVar1;
        auVar17[0xe] = uVar1;
        auVar17[0xf] = uVar1;
        pauVar15 = (undefined1 (*) [16])local_438;
        auVar29._8_2_ = 0x10;
        auVar29._0_8_ = 0x10001000100010;
        auVar29._10_2_ = 0x10;
        auVar29._12_2_ = 0x10;
        auVar29._14_2_ = 0x10;
        auVar29._16_2_ = 0x10;
        auVar29._18_2_ = 0x10;
        auVar29._20_2_ = 0x10;
        auVar29._22_2_ = 0x10;
        auVar29._24_2_ = 0x10;
        auVar29._26_2_ = 0x10;
        auVar29._28_2_ = 0x10;
        auVar29._30_2_ = 0x10;
        uVar16 = 0;
        auVar22._8_2_ = 0x1f;
        auVar22._0_8_ = 0x1f001f001f001f;
        auVar22._10_2_ = 0x1f;
        auVar22._12_2_ = 0x1f;
        auVar22._14_2_ = 0x1f;
        auVar22._16_2_ = 0x1f;
        auVar22._18_2_ = 0x1f;
        auVar22._20_2_ = 0x1f;
        auVar22._22_2_ = 0x1f;
        auVar22._24_2_ = 0x1f;
        auVar22._26_2_ = 0x1f;
        auVar22._28_2_ = 0x1f;
        auVar22._30_2_ = 0x1f;
        uVar13 = uVar14;
        uVar9 = dx;
        do {
          iVar11 = (int)uVar9 >> (6 - bVar5 & 0x1f);
          uVar10 = iVar8 - iVar11 >> (bVar5 & 0x1f);
          pauVar7 = pauVar15;
          uVar12 = uVar13;
          if ((int)uVar10 < 1) {
            do {
              *pauVar7 = auVar17;
              uVar12 = uVar12 - 1;
              pauVar7 = pauVar7 + 1;
            } while (uVar12 != 0);
          }
          else {
            uVar6 = 4;
            if ((int)uVar10 < 4) {
              uVar6 = uVar10;
            }
            auVar24 = *(undefined1 (*) [16])(above + iVar11);
            if (upsample_above == 0) {
              auVar23 = *(undefined1 (*) [16])(above + (long)iVar11 + 1);
              uVar2 = (ushort)(uVar9 >> 1);
              uVar25 = uVar2 & 0x1f;
              auVar32._0_8_ =
                   CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2))) & 0x1f001f001f001f;
              auVar32._8_2_ = uVar25;
              auVar32._10_2_ = uVar25;
              auVar32._12_2_ = uVar25;
              auVar32._14_2_ = uVar25;
              auVar32._16_2_ = uVar25;
              auVar32._18_2_ = uVar25;
              auVar32._20_2_ = uVar25;
              auVar32._22_2_ = uVar25;
              auVar32._24_2_ = uVar25;
              auVar32._26_2_ = uVar25;
              auVar32._28_2_ = uVar25;
              auVar32._30_2_ = uVar25;
            }
            else {
              auVar24 = vpshufb_avx(auVar24,_DAT_005164c0);
              auVar23 = vpsrldq_avx(auVar24,8);
              auVar31._0_2_ = (undefined2)uVar9;
              auVar31._2_2_ = auVar31._0_2_;
              auVar31._4_2_ = auVar31._0_2_;
              auVar31._6_2_ = auVar31._0_2_;
              auVar31._8_2_ = auVar31._0_2_;
              auVar31._10_2_ = auVar31._0_2_;
              auVar31._12_2_ = auVar31._0_2_;
              auVar31._14_2_ = auVar31._0_2_;
              auVar31._16_2_ = auVar31._0_2_;
              auVar31._18_2_ = auVar31._0_2_;
              auVar31._20_2_ = auVar31._0_2_;
              auVar31._22_2_ = auVar31._0_2_;
              auVar31._24_2_ = auVar31._0_2_;
              auVar31._26_2_ = auVar31._0_2_;
              auVar31._28_2_ = auVar31._0_2_;
              auVar31._30_2_ = auVar31._0_2_;
              auVar32 = vpsllw_avx2(auVar31,ZEXT416((uint)upsample_above));
              auVar32 = vpsrlw_avx2(auVar32,1);
              auVar32 = vpand_avx2(auVar32,auVar22);
            }
            auVar31 = vpmovzxbw_avx2(auVar24);
            auVar18 = vpmovzxbw_avx2(auVar23);
            auVar18 = vpsubw_avx2(auVar18,auVar31);
            auVar18 = vpmullw_avx2(auVar18,auVar32);
            auVar32 = vpsllw_avx2(auVar31,5);
            auVar32 = vpaddw_avx2(auVar32,auVar29);
            auVar32 = vpaddw_avx2(auVar18,auVar32);
            auVar32 = vpsrlw_avx2(auVar32,5);
            auVar24 = vpackuswb_avx(auVar32._0_16_,auVar32._16_16_);
            auVar24 = vpblendvb_avx(auVar17,auVar24,*(undefined1 (*) [16])BaseMask[uVar6]);
            *(undefined1 (*) [16])(local_438 + uVar16 * 2) = auVar24;
            uVar9 = uVar9 + dx;
          }
          if ((int)uVar10 < 1) break;
          uVar16 = uVar16 + 1;
          uVar13 = uVar13 - 1;
          pauVar15 = pauVar15 + 1;
        } while (uVar16 != uVar14);
        if (0 < bh) {
          lVar4 = 0;
          do {
            *(undefined4 *)dst = *(undefined4 *)((long)local_438 + lVar4);
            lVar4 = lVar4 + 0x10;
            dst = dst + stride;
          } while (uVar14 << 4 != lVar4);
        }
      }
    }
    else if ((bw == 8) && (iVar8 = bh + 7 << (bVar5 & 0x1f), 0 < bh)) {
      uVar1 = above[iVar8];
      auVar24[1] = uVar1;
      auVar24[0] = uVar1;
      auVar24[2] = uVar1;
      auVar24[3] = uVar1;
      auVar24[4] = uVar1;
      auVar24[5] = uVar1;
      auVar24[6] = uVar1;
      auVar24[7] = uVar1;
      auVar24[8] = uVar1;
      auVar24[9] = uVar1;
      auVar24[10] = uVar1;
      auVar24[0xb] = uVar1;
      auVar24[0xc] = uVar1;
      auVar24[0xd] = uVar1;
      auVar24[0xe] = uVar1;
      auVar24[0xf] = uVar1;
      pauVar15 = (undefined1 (*) [16])local_438;
      auVar18._8_2_ = 0x10;
      auVar18._0_8_ = 0x10001000100010;
      auVar18._10_2_ = 0x10;
      auVar18._12_2_ = 0x10;
      auVar18._14_2_ = 0x10;
      auVar18._16_2_ = 0x10;
      auVar18._18_2_ = 0x10;
      auVar18._20_2_ = 0x10;
      auVar18._22_2_ = 0x10;
      auVar18._24_2_ = 0x10;
      auVar18._26_2_ = 0x10;
      auVar18._28_2_ = 0x10;
      auVar18._30_2_ = 0x10;
      uVar16 = 0;
      auVar20._8_2_ = 0x1f;
      auVar20._0_8_ = 0x1f001f001f001f;
      auVar20._10_2_ = 0x1f;
      auVar20._12_2_ = 0x1f;
      auVar20._14_2_ = 0x1f;
      auVar20._16_2_ = 0x1f;
      auVar20._18_2_ = 0x1f;
      auVar20._20_2_ = 0x1f;
      auVar20._22_2_ = 0x1f;
      auVar20._24_2_ = 0x1f;
      auVar20._26_2_ = 0x1f;
      auVar20._28_2_ = 0x1f;
      auVar20._30_2_ = 0x1f;
      uVar13 = uVar14;
      uVar9 = dx;
      do {
        iVar11 = (int)uVar9 >> (6 - bVar5 & 0x1f);
        uVar10 = iVar8 - iVar11 >> (bVar5 & 0x1f);
        pauVar7 = pauVar15;
        uVar12 = uVar13;
        if ((int)uVar10 < 1) {
          do {
            *pauVar7 = auVar24;
            uVar12 = uVar12 - 1;
            pauVar7 = pauVar7 + 1;
          } while (uVar12 != 0);
        }
        else {
          uVar6 = 8;
          if ((int)uVar10 < 8) {
            uVar6 = uVar10;
          }
          auVar17 = *(undefined1 (*) [16])(above + iVar11);
          if (upsample_above == 0) {
            auVar23 = *(undefined1 (*) [16])(above + (long)iVar11 + 1);
            uVar2 = (ushort)(uVar9 >> 1);
            uVar25 = uVar2 & 0x1f;
            auVar27._0_8_ = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2))) & 0x1f001f001f001f
            ;
            auVar27._8_2_ = uVar25;
            auVar27._10_2_ = uVar25;
            auVar27._12_2_ = uVar25;
            auVar27._14_2_ = uVar25;
            auVar27._16_2_ = uVar25;
            auVar27._18_2_ = uVar25;
            auVar27._20_2_ = uVar25;
            auVar27._22_2_ = uVar25;
            auVar27._24_2_ = uVar25;
            auVar27._26_2_ = uVar25;
            auVar27._28_2_ = uVar25;
            auVar27._30_2_ = uVar25;
          }
          else {
            auVar17 = vpshufb_avx(auVar17,_DAT_005164c0);
            auVar23 = vpsrldq_avx(auVar17,8);
            auVar26._0_2_ = (undefined2)uVar9;
            auVar26._2_2_ = auVar26._0_2_;
            auVar26._4_2_ = auVar26._0_2_;
            auVar26._6_2_ = auVar26._0_2_;
            auVar26._8_2_ = auVar26._0_2_;
            auVar26._10_2_ = auVar26._0_2_;
            auVar26._12_2_ = auVar26._0_2_;
            auVar26._14_2_ = auVar26._0_2_;
            auVar26._16_2_ = auVar26._0_2_;
            auVar26._18_2_ = auVar26._0_2_;
            auVar26._20_2_ = auVar26._0_2_;
            auVar26._22_2_ = auVar26._0_2_;
            auVar26._24_2_ = auVar26._0_2_;
            auVar26._26_2_ = auVar26._0_2_;
            auVar26._28_2_ = auVar26._0_2_;
            auVar26._30_2_ = auVar26._0_2_;
            auVar29 = vpsllw_avx2(auVar26,ZEXT416((uint)upsample_above));
            auVar29 = vpsrlw_avx2(auVar29,1);
            auVar27 = vpand_avx2(auVar29,auVar20);
          }
          auVar29 = vpmovzxbw_avx2(auVar17);
          auVar22 = vpmovzxbw_avx2(auVar23);
          auVar22 = vpsubw_avx2(auVar22,auVar29);
          auVar22 = vpmullw_avx2(auVar22,auVar27);
          auVar29 = vpsllw_avx2(auVar29,5);
          auVar29 = vpaddw_avx2(auVar29,auVar18);
          auVar29 = vpaddw_avx2(auVar22,auVar29);
          auVar29 = vpsrlw_avx2(auVar29,5);
          auVar17 = vpackuswb_avx(auVar29._0_16_,auVar29._16_16_);
          auVar17 = vpblendvb_avx(auVar24,auVar17,*(undefined1 (*) [16])BaseMask[uVar6]);
          *(undefined1 (*) [16])(local_438 + uVar16 * 2) = auVar17;
          uVar9 = uVar9 + dx;
        }
        if ((int)uVar10 < 1) break;
        uVar16 = uVar16 + 1;
        uVar13 = uVar13 - 1;
        pauVar15 = pauVar15 + 1;
      } while (uVar16 != uVar14);
      if (0 < bh) {
        lVar4 = 0;
        do {
          *(undefined8 *)dst = *(undefined8 *)((long)local_438 + lVar4);
          lVar4 = lVar4 + 0x10;
          dst = dst + stride;
        } while (uVar14 << 4 != lVar4);
      }
    }
  }
  else if (bw == 0x10) {
    iVar8 = bh + 0xf << (bVar5 & 0x1f);
    if (0 < bh) {
      uVar1 = above[iVar8];
      auVar23[1] = uVar1;
      auVar23[0] = uVar1;
      auVar23[2] = uVar1;
      auVar23[3] = uVar1;
      auVar23[4] = uVar1;
      auVar23[5] = uVar1;
      auVar23[6] = uVar1;
      auVar23[7] = uVar1;
      auVar23[8] = uVar1;
      auVar23[9] = uVar1;
      auVar23[10] = uVar1;
      auVar23[0xb] = uVar1;
      auVar23[0xc] = uVar1;
      auVar23[0xd] = uVar1;
      auVar23[0xe] = uVar1;
      auVar23[0xf] = uVar1;
      pauVar15 = (undefined1 (*) [16])local_438;
      auVar19._8_2_ = 0x10;
      auVar19._0_8_ = 0x10001000100010;
      auVar19._10_2_ = 0x10;
      auVar19._12_2_ = 0x10;
      auVar19._14_2_ = 0x10;
      auVar19._16_2_ = 0x10;
      auVar19._18_2_ = 0x10;
      auVar19._20_2_ = 0x10;
      auVar19._22_2_ = 0x10;
      auVar19._24_2_ = 0x10;
      auVar19._26_2_ = 0x10;
      auVar19._28_2_ = 0x10;
      auVar19._30_2_ = 0x10;
      uVar16 = 0;
      auVar21._8_2_ = 0x1f;
      auVar21._0_8_ = 0x1f001f001f001f;
      auVar21._10_2_ = 0x1f;
      auVar21._12_2_ = 0x1f;
      auVar21._14_2_ = 0x1f;
      auVar21._16_2_ = 0x1f;
      auVar21._18_2_ = 0x1f;
      auVar21._20_2_ = 0x1f;
      auVar21._22_2_ = 0x1f;
      auVar21._24_2_ = 0x1f;
      auVar21._26_2_ = 0x1f;
      auVar21._28_2_ = 0x1f;
      auVar21._30_2_ = 0x1f;
      uVar13 = uVar14;
      uVar9 = dx;
      do {
        iVar11 = (int)uVar9 >> (6 - bVar5 & 0x1f);
        uVar10 = iVar8 - iVar11 >> (bVar5 & 0x1f);
        pauVar7 = pauVar15;
        uVar12 = uVar13;
        if ((int)uVar10 < 1) {
          do {
            *pauVar7 = auVar23;
            uVar12 = uVar12 - 1;
            pauVar7 = pauVar7 + 1;
          } while (uVar12 != 0);
        }
        else {
          uVar6 = 0x10;
          if ((int)uVar10 < 0x10) {
            uVar6 = uVar10;
          }
          auVar17 = *(undefined1 (*) [16])(above + iVar11);
          if (upsample_above == 0) {
            auVar24 = *(undefined1 (*) [16])(above + (long)iVar11 + 1);
            uVar2 = (ushort)(uVar9 >> 1);
            uVar25 = uVar2 & 0x1f;
            auVar30._0_8_ = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2))) & 0x1f001f001f001f
            ;
            auVar30._8_2_ = uVar25;
            auVar30._10_2_ = uVar25;
            auVar30._12_2_ = uVar25;
            auVar30._14_2_ = uVar25;
            auVar30._16_2_ = uVar25;
            auVar30._18_2_ = uVar25;
            auVar30._20_2_ = uVar25;
            auVar30._22_2_ = uVar25;
            auVar30._24_2_ = uVar25;
            auVar30._26_2_ = uVar25;
            auVar30._28_2_ = uVar25;
            auVar30._30_2_ = uVar25;
          }
          else {
            auVar17 = vpshufb_avx(auVar17,_DAT_005164c0);
            auVar24 = vpsrldq_avx(auVar17,8);
            auVar28._0_2_ = (undefined2)uVar9;
            auVar28._2_2_ = auVar28._0_2_;
            auVar28._4_2_ = auVar28._0_2_;
            auVar28._6_2_ = auVar28._0_2_;
            auVar28._8_2_ = auVar28._0_2_;
            auVar28._10_2_ = auVar28._0_2_;
            auVar28._12_2_ = auVar28._0_2_;
            auVar28._14_2_ = auVar28._0_2_;
            auVar28._16_2_ = auVar28._0_2_;
            auVar28._18_2_ = auVar28._0_2_;
            auVar28._20_2_ = auVar28._0_2_;
            auVar28._22_2_ = auVar28._0_2_;
            auVar28._24_2_ = auVar28._0_2_;
            auVar28._26_2_ = auVar28._0_2_;
            auVar28._28_2_ = auVar28._0_2_;
            auVar28._30_2_ = auVar28._0_2_;
            auVar29 = vpsllw_avx2(auVar28,ZEXT416((uint)upsample_above));
            auVar29 = vpsrlw_avx2(auVar29,1);
            auVar30 = vpand_avx2(auVar29,auVar21);
          }
          auVar29 = vpmovzxbw_avx2(auVar17);
          auVar22 = vpmovzxbw_avx2(auVar24);
          auVar22 = vpsubw_avx2(auVar22,auVar29);
          auVar22 = vpmullw_avx2(auVar22,auVar30);
          auVar29 = vpsllw_avx2(auVar29,5);
          auVar29 = vpaddw_avx2(auVar29,auVar19);
          auVar29 = vpaddw_avx2(auVar22,auVar29);
          auVar29 = vpsrlw_avx2(auVar29,5);
          auVar17 = vpackuswb_avx(auVar29._0_16_,auVar29._16_16_);
          auVar17 = vpblendvb_avx(auVar23,auVar17,*(undefined1 (*) [16])BaseMask[uVar6]);
          *(undefined1 (*) [16])(local_438 + uVar16 * 2) = auVar17;
          uVar9 = uVar9 + dx;
        }
        if ((int)uVar10 < 1) break;
        uVar16 = uVar16 + 1;
        uVar13 = uVar13 - 1;
        pauVar15 = pauVar15 + 1;
      } while (uVar16 != uVar14);
      if (0 < bh) {
        lVar4 = 0;
        do {
          uVar3 = *(undefined8 *)((long)local_438 + lVar4 + 8);
          *(undefined8 *)dst = *(undefined8 *)((long)local_438 + lVar4);
          *(undefined8 *)(dst + 8) = uVar3;
          lVar4 = lVar4 + 0x10;
          dst = dst + stride;
        } while (uVar14 << 4 != lVar4);
      }
    }
  }
  else {
    if (bw == 0x20) {
      dr_prediction_z1_32xN_avx2(bh,dst,stride,above,dx,(int)left);
      return;
    }
    if (bw == 0x40) {
      dr_prediction_z1_64xN_avx2(bh,dst,stride,above,dx,(int)left);
      return;
    }
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_above, int dx, int dy) {
  (void)left;
  (void)dy;
  switch (bw) {
    case 4:
      dr_prediction_z1_4xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 8:
      dr_prediction_z1_8xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 16:
      dr_prediction_z1_16xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 32:
      dr_prediction_z1_32xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    case 64:
      dr_prediction_z1_64xN_avx2(bh, dst, stride, above, upsample_above, dx);
      break;
    default: break;
  }
  return;
}